

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

JSValue js_string___GetSubstitution(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  int64_t iVar1;
  JSValue val;
  JSValue v;
  JSValue JVar2;
  JSValue v_00;
  JSValue v_01;
  int iVar3;
  uint uVar4;
  int iVar5;
  JSContext *in_RDI;
  long in_R8;
  JSValue JVar6;
  JSString *rp;
  JSString *sp;
  StringBuffer *b;
  StringBuffer b_s;
  int c1;
  int c;
  int k1;
  int k;
  int j0;
  int j;
  int i;
  uint32_t captures_len;
  uint32_t matched_len;
  uint32_t len;
  uint32_t position;
  JSValue s;
  JSValue name;
  JSValue capture;
  JSValue rep;
  JSValue namedCaptures;
  JSValue captures;
  JSValue str;
  JSValue matched;
  uint32_t in_stack_fffffffffffffea8;
  uint32_t in_stack_fffffffffffffeac;
  JSValueUnion in_stack_fffffffffffffeb0;
  JSValueUnion in_stack_fffffffffffffeb8;
  int64_t in_stack_fffffffffffffec0;
  uint32_t *in_stack_fffffffffffffec8;
  StringBuffer *s_00;
  int in_stack_fffffffffffffed0;
  int in_stack_fffffffffffffed4;
  JSValueUnion in_stack_fffffffffffffed8;
  JSValueUnion ctx_00;
  JSValueUnion JVar7;
  JSContext *ctx_01;
  JSValue in_stack_fffffffffffffef8;
  JSValue in_stack_ffffffffffffff08;
  uint local_d0;
  uint local_cc;
  JSValueUnion JVar8;
  JSValueUnion local_10;
  int64_t local_8;
  
  ctx_01 = (JSContext *)&stack0xfffffffffffffef8;
  JVar7 = ((JSValue *)(in_R8 + 0x10))->u;
  JVar6 = *(JSValue *)(in_R8 + 0x10);
  JVar2 = *(JSValue *)(in_R8 + 0x30);
  JVar8 = *(JSValueUnion *)(in_R8 + 0x40);
  iVar1 = *(int64_t *)(in_R8 + 0x48);
  ctx_00 = (JSValueUnion)((JSValueUnion *)(in_R8 + 0x50))->ptr;
  iVar3 = JS_IsString(*(JSValue *)(in_R8 + 0x50));
  if ((iVar3 == 0) || (iVar3 = JS_IsString(JVar6), iVar3 == 0)) {
    _local_10 = JS_ThrowTypeError(in_RDI,"not a string");
  }
  else {
    string_buffer_init((JSContext *)in_stack_fffffffffffffeb0.ptr,
                       (StringBuffer *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8)
                       ,0);
    iVar3 = JS_IsUndefined(JVar2);
    if ((((iVar3 == 0) &&
         (JVar6.tag = (int64_t)ctx_00.ptr, JVar6.u.ptr = in_stack_fffffffffffffed8.ptr,
         iVar3 = js_get_length32((JSContext *)
                                 CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                                 in_stack_fffffffffffffec8,JVar6), iVar3 != 0)) ||
        (JVar2.tag = (int64_t)ctx_00.ptr, JVar2.u.ptr = in_stack_fffffffffffffed8.ptr,
        iVar3 = js_get_length32((JSContext *)
                                CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                                in_stack_fffffffffffffec8,JVar2), iVar3 != 0)) ||
       (val.tag = in_stack_fffffffffffffec0, val.u.ptr = in_stack_fffffffffffffeb8.ptr,
       iVar3 = JS_ToUint32((JSContext *)in_stack_fffffffffffffeb0.ptr,
                           (uint32_t *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8)
                           ,val), iVar3 < 0)) {
LAB_001767d7:
      string_buffer_free((StringBuffer *)0x1767e1);
      local_10.ptr = (void *)(local_10 << 0x20);
      local_8 = 6;
    }
    else {
      uVar4 = (uint)*(undefined8 *)((long)ctx_00.ptr + 4) & 0x7fffffff;
      local_cc = 0;
      while ((iVar3 = string_indexof_char((JSString *)ctx_00.ptr,0x24,local_cc), -1 < iVar3 &&
             (iVar3 + 1U < uVar4))) {
        string_buffer_concat
                  ((StringBuffer *)in_stack_fffffffffffffeb8.ptr,
                   (JSString *)in_stack_fffffffffffffeb0.ptr,in_stack_fffffffffffffeac,
                   in_stack_fffffffffffffea8);
        local_d0 = iVar3 + 2;
        iVar3 = string_get((JSString *)ctx_00.ptr,iVar3 + 1);
        if (iVar3 == 0x24) {
          string_buffer_putc8((StringBuffer *)
                              CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),0);
        }
        else if (iVar3 == 0x26) {
          v_00.tag = (int64_t)JVar7.ptr;
          v_00.u.float64 = ctx_00.float64;
          iVar3 = string_buffer_concat_value((StringBuffer *)in_stack_fffffffffffffed8.ptr,v_00);
          if (iVar3 != 0) goto LAB_001767d7;
        }
        else if (iVar3 == 0x60) {
          string_buffer_concat
                    ((StringBuffer *)in_stack_fffffffffffffeb8.ptr,
                     (JSString *)in_stack_fffffffffffffeb0.ptr,in_stack_fffffffffffffeac,
                     in_stack_fffffffffffffea8);
        }
        else if (iVar3 == 0x27) {
          string_buffer_concat
                    ((StringBuffer *)in_stack_fffffffffffffeb8.ptr,
                     (JSString *)in_stack_fffffffffffffeb0.ptr,in_stack_fffffffffffffeac,
                     in_stack_fffffffffffffea8);
        }
        else {
          if ((iVar3 < 0x30) || (0x39 < iVar3)) {
            if ((iVar3 == 0x3c) &&
               ((v_01.tag = iVar1, v_01.u.float64 = JVar8.float64, iVar3 = JS_IsUndefined(v_01),
                iVar3 == 0 &&
                (iVar3 = string_indexof_char((JSString *)ctx_00.ptr,0x3e,local_d0), -1 < iVar3)))) {
              JVar6 = js_sub_string((JSContext *)ctx_00.ptr,
                                    (JSString *)in_stack_fffffffffffffed8.ptr,
                                    in_stack_fffffffffffffed4,in_stack_fffffffffffffed0);
              s_00 = (StringBuffer *)JVar6.tag;
              iVar5 = JS_IsException(JVar6);
              if (iVar5 == 0) {
                JVar6 = JS_GetPropertyValue(ctx_01,in_stack_ffffffffffffff08,
                                            in_stack_fffffffffffffef8);
                in_stack_fffffffffffffeb0 = JVar6.u;
                in_stack_fffffffffffffeb8 = (JSValueUnion)JVar6.tag;
                iVar5 = JS_IsException(JVar6);
                if ((iVar5 == 0) &&
                   ((iVar5 = JS_IsUndefined(JVar6), iVar5 != 0 ||
                    (v.u._4_4_ = in_stack_fffffffffffffed4, v.u.int32 = in_stack_fffffffffffffed0,
                    v.tag = (int64_t)in_stack_fffffffffffffed8.ptr,
                    iVar5 = string_buffer_concat_value_free(s_00,v), iVar5 == 0)))) {
                  local_d0 = iVar3 + 1;
                  goto LAB_00176781;
                }
              }
              goto LAB_001767d7;
            }
          }
          else if (local_d0 < uVar4) {
            string_get((JSString *)ctx_00.ptr,local_d0);
          }
          string_buffer_concat
                    ((StringBuffer *)in_stack_fffffffffffffeb8.ptr,
                     (JSString *)in_stack_fffffffffffffeb0.ptr,in_stack_fffffffffffffeac,
                     in_stack_fffffffffffffea8);
        }
LAB_00176781:
        local_cc = local_d0;
      }
      string_buffer_concat
                ((StringBuffer *)in_stack_fffffffffffffeb8.ptr,
                 (JSString *)in_stack_fffffffffffffeb0.ptr,in_stack_fffffffffffffeac,
                 in_stack_fffffffffffffea8);
      _local_10 = string_buffer_end((StringBuffer *)in_stack_fffffffffffffeb0.ptr);
    }
  }
  return _local_10;
}

Assistant:

static JSValue js_string___GetSubstitution(JSContext *ctx, JSValueConst this_val,
                                           int argc, JSValueConst *argv)
{
    // GetSubstitution(matched, str, position, captures, namedCaptures, rep)
    JSValueConst matched, str, captures, namedCaptures, rep;
    JSValue capture, name, s;
    uint32_t position, len, matched_len, captures_len;
    int i, j, j0, k, k1;
    int c, c1;
    StringBuffer b_s, *b = &b_s;
    JSString *sp, *rp;

    matched = argv[0];
    str = argv[1];
    captures = argv[3];
    namedCaptures = argv[4];
    rep = argv[5];

    if (!JS_IsString(rep) || !JS_IsString(str))
        return JS_ThrowTypeError(ctx, "not a string");

    sp = JS_VALUE_GET_STRING(str);
    rp = JS_VALUE_GET_STRING(rep);

    string_buffer_init(ctx, b, 0);

    captures_len = 0;
    if (!JS_IsUndefined(captures)) {
        if (js_get_length32(ctx, &captures_len, captures))
            goto exception;
    }
    if (js_get_length32(ctx, &matched_len, matched))
        goto exception;
    if (JS_ToUint32(ctx, &position, argv[2]) < 0)
        goto exception;

    len = rp->len;
    i = 0;
    for(;;) {
        j = string_indexof_char(rp, '$', i);
        if (j < 0 || j + 1 >= len)
            break;
        string_buffer_concat(b, rp, i, j);
        j0 = j++;
        c = string_get(rp, j++);
        if (c == '$') {
            string_buffer_putc8(b, '$');
        } else if (c == '&') {
            if (string_buffer_concat_value(b, matched))
                goto exception;
        } else if (c == '`') {
            string_buffer_concat(b, sp, 0, position);
        } else if (c == '\'') {
            string_buffer_concat(b, sp, position + matched_len, sp->len);
        } else if (c >= '0' && c <= '9') {
            k = c - '0';
            if (j < len) {
                c1 = string_get(rp, j);
                if (c1 >= '0' && c1 <= '9') {
                    /* This behavior is specified in ES6 and refined in ECMA 2019 */
                    /* ECMA 2019 does not have the extra test, but
                       Test262 S15.5.4.11_A3_T1..3 require this behavior */
                    k1 = k * 10 + c1 - '0';
                    if (k1 >= 1 && k1 < captures_len) {
                        k = k1;
                        j++;
                    }
                }
            }
            if (k >= 1 && k < captures_len) {
                s = JS_GetPropertyInt64(ctx, captures, k);
                if (JS_IsException(s))
                    goto exception;
                if (!JS_IsUndefined(s)) {
                    if (string_buffer_concat_value_free(b, s))
                        goto exception;
                }
            } else {
                goto norep;
            }
        } else if (c == '<' && !JS_IsUndefined(namedCaptures)) {
            k = string_indexof_char(rp, '>', j);
            if (k < 0)
                goto norep;
            name = js_sub_string(ctx, rp, j, k);
            if (JS_IsException(name))
                goto exception;
            capture = JS_GetPropertyValue(ctx, namedCaptures, name);
            if (JS_IsException(capture))
                goto exception;
            if (!JS_IsUndefined(capture)) {
                if (string_buffer_concat_value_free(b, capture))
                    goto exception;
            }
            j = k + 1;
        } else {
        norep:
            string_buffer_concat(b, rp, j0, j);
        }
        i = j;
    }
    string_buffer_concat(b, rp, i, rp->len);
    return string_buffer_end(b);
exception:
    string_buffer_free(b);
    return JS_EXCEPTION;
}